

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O2

int __thiscall
jrtplib::RTPUDPv4Transmitter::JoinMulticastGroup(RTPUDPv4Transmitter *this,RTPAddress *addr)

{
  uint uVar1;
  int iVar2;
  uint32_t mcastIP;
  ip_mreq mreq;
  
  if (this->init == true) {
    if (this->created == true) {
      if (addr->addresstype == IPv4Address) {
        mcastIP = *(uint32_t *)&addr->field_0xc;
        if ((mcastIP & 0xf0000000) == 0xe0000000) {
          iVar2 = RTPHashTable<const_unsigned_int,_jrtplib::RTPUDPv4Trans_GetHashIndex_uint32_t,_8317>
                  ::AddElement(&this->multicastgroups,&mcastIP);
          if (-1 < iVar2) {
            mreq.imr_multiaddr.s_addr =
                 mcastIP >> 0x18 | (mcastIP & 0xff0000) >> 8 | (mcastIP & 0xff00) << 8 |
                 mcastIP << 0x18;
            uVar1 = this->mcastifaceIP;
            mreq.imr_interface.s_addr =
                 uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
            iVar2 = setsockopt(this->rtpsock,0,0x23,&mreq,8);
            if (iVar2 == 0) {
              if (this->rtpsock == this->rtcpsock) {
                return 0;
              }
              mreq.imr_multiaddr.s_addr =
                   mcastIP >> 0x18 | (mcastIP & 0xff0000) >> 8 | (mcastIP & 0xff00) << 8 |
                   mcastIP << 0x18;
              uVar1 = this->mcastifaceIP;
              mreq.imr_interface.s_addr =
                   uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
              iVar2 = setsockopt(this->rtcpsock,0,0x23,&mreq,8);
              if (iVar2 == 0) {
                return 0;
              }
              mreq.imr_multiaddr.s_addr =
                   mcastIP >> 0x18 | (mcastIP & 0xff0000) >> 8 | (mcastIP & 0xff00) << 8 |
                   mcastIP << 0x18;
              uVar1 = this->mcastifaceIP;
              mreq.imr_interface.s_addr =
                   uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
              setsockopt(this->rtpsock,0,0x24,&mreq,8);
            }
            RTPHashTable<const_unsigned_int,_jrtplib::RTPUDPv4Trans_GetHashIndex_uint32_t,_8317>::
            DeleteElement(&this->multicastgroups,&mcastIP);
            iVar2 = -0x51;
          }
        }
        else {
          iVar2 = -0x58;
        }
      }
      else {
        iVar2 = -0x54;
      }
    }
    else {
      iVar2 = -0x59;
    }
  }
  else {
    iVar2 = -0x5a;
  }
  return iVar2;
}

Assistant:

int RTPUDPv4Transmitter::JoinMulticastGroup(const RTPAddress &addr)
{
	if (!init)
		return ERR_RTP_UDPV4TRANS_NOTINIT;

	MAINMUTEX_LOCK
	
	int status;
	
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV4TRANS_NOTCREATED;
	}
	if (addr.GetAddressType() != RTPAddress::IPv4Address)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV4TRANS_INVALIDADDRESSTYPE;
	}
	
	const RTPIPv4Address &address = (const RTPIPv4Address &)addr;
	uint32_t mcastIP = address.GetIP();
	
	if (!RTPUDPV4TRANS_IS_MCASTADDR(mcastIP))
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV4TRANS_NOTAMULTICASTADDRESS;
	}
	
	status = multicastgroups.AddElement(mcastIP);
	if (status >= 0)
	{
		RTPUDPV4TRANS_MCASTMEMBERSHIP(rtpsock,IP_ADD_MEMBERSHIP,mcastIP,status);
		if (status != 0)
		{
			multicastgroups.DeleteElement(mcastIP);
			MAINMUTEX_UNLOCK
			return ERR_RTP_UDPV4TRANS_COULDNTJOINMULTICASTGROUP;
		}

		if (rtpsock != rtcpsock) // no need to join multicast group twice when multiplexing
		{
			RTPUDPV4TRANS_MCASTMEMBERSHIP(rtcpsock,IP_ADD_MEMBERSHIP,mcastIP,status);
			if (status != 0)
			{
				RTPUDPV4TRANS_MCASTMEMBERSHIP(rtpsock,IP_DROP_MEMBERSHIP,mcastIP,status);
				multicastgroups.DeleteElement(mcastIP);
				MAINMUTEX_UNLOCK
				return ERR_RTP_UDPV4TRANS_COULDNTJOINMULTICASTGROUP;
			}
		}
	}
	MAINMUTEX_UNLOCK	
	return status;
}